

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serialization.h
# Opt level: O0

void tsbp::Serializer::WriteToJson<tsbp::Packing2D>(Packing2D *classToSerialize,string *filePath)

{
  byte bVar1;
  _Setw _Var2;
  exception *this;
  ostream *o;
  undefined1 local_288 [8];
  json jsonFile;
  exception local_268 [8];
  failure ex;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  ostream local_218 [8];
  ofstream ofs;
  string *filePath_local;
  Packing2D *classToSerialize_local;
  
  std::operator+(&local_238,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)filePath,
                 ".json");
  std::ofstream::ofstream(local_218,&local_238,0x10);
  std::__cxx11::string::~string((string *)&local_238);
  bVar1 = std::ofstream::is_open();
  if ((bVar1 & 1) == 0) {
    std::error_code::error_code<std::io_errc,void>((error_code *)&jsonFile.m_value,stream);
    std::ios_base::failure[abi:cxx11]::failure
              ((char *)local_268,(error_code *)"File stream not open.");
    this = (exception *)__cxa_allocate_exception(8);
    CLI::std::exception::exception(this,local_268);
    __cxa_throw(this,&std::exception::typeinfo,std::exception::~exception);
  }
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::basic_json<tsbp::Packing2D_&,_tsbp::Packing2D,_0>
            ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              *)local_288,classToSerialize);
  _Var2 = CLI::std::setw(2);
  o = std::operator<<(local_218,(_Setw)_Var2._M_n);
  nlohmann::operator<<
            (o,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)local_288);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 *)local_288);
  std::ofstream::close();
  std::ofstream::~ofstream(local_218);
  return;
}

Assistant:

static void WriteToJson(T& classToSerialize, const std::string& filePath)
    {
        std::ofstream ofs(filePath + ".json");
        {
            if (!ofs.is_open())
            {
                auto ex = std::ios_base::failure("File stream not open.");
                throw std::exception(ex);
            }

            json jsonFile = classToSerialize;
            ofs << std::setw(2) << jsonFile;
        }

        ofs.close();
    }